

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O0

EncodeParams *
cinemo::threading::divideWork
          (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw,long numThreads
          )

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long *plVar3;
  size_type sVar4;
  const_reference __x;
  EncodeParams *pEVar5;
  ulong uVar6;
  bool bVar7;
  EncodeParams *local_40;
  int local_28;
  int local_24;
  int i;
  int ja;
  EncodeParams *wp;
  long numThreads_local;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = numThreads;
  uVar2 = SUB168(auVar1 * ZEXT816(0x28),0);
  uVar6 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar6 = 0xffffffffffffffff;
  }
  plVar3 = (long *)operator_new__(uVar6);
  *plVar3 = numThreads;
  pEVar5 = (EncodeParams *)(plVar3 + 1);
  if (numThreads != 0) {
    local_40 = pEVar5;
    do {
      EncodeParams::EncodeParams(local_40);
      local_40 = local_40 + 1;
    } while (local_40 != pEVar5 + numThreads);
  }
  local_24 = 0;
  while (sVar4 = std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::size
                           (lw), (ulong)(long)local_24 < sVar4) {
    local_28 = 0;
    while( true ) {
      bVar7 = false;
      if (local_28 < numThreads) {
        sVar4 = std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::size(lw)
        ;
        bVar7 = (ulong)(long)local_24 < sVar4;
      }
      if (!bVar7) break;
      __x = std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::operator[]
                      (lw,(long)local_24);
      std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::push_back
                (&pEVar5[local_28].works,__x);
      local_28 = local_28 + 1;
      local_24 = local_24 + 1;
    }
  }
  return pEVar5;
}

Assistant:

static EncodeParams* divideWork(const vector<LameWrapper*>& lw,
                                      long numThreads) {
            EncodeParams* wp = new EncodeParams[numThreads];
            int ja = 0; //Jobs Assigned

            while (ja < lw.size()) {
                for (int i = 0; i < numThreads && ja < lw.size(); ++i) {
                    wp[i].works.push_back(lw[ja++]);
                }
            }

            return wp;
        }